

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

void google::glog_internal_namespace_::ShutdownGoogleLoggingUtilities(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_20;
  LogMessageVoidify local_9;
  
  bVar1 = IsGoogleLoggingInitialized();
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    g_program_invocation_short_name = 0;
    closelog();
    return;
  }
  LogMessageVoidify::LogMessageVoidify(&local_9);
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/utilities.cc"
             ,0x169);
  poVar2 = LogMessage::stream(&local_20);
  poVar2 = std::operator<<(poVar2,"Check failed: IsGoogleLoggingInitialized() ");
  poVar2 = std::operator<<(poVar2,
                           "You called ShutdownGoogleLogging() without calling InitGoogleLogging() first!"
                          );
  LogMessageVoidify::operator&(&local_9,poVar2);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

void ShutdownGoogleLoggingUtilities() {
  CHECK(IsGoogleLoggingInitialized())
      << "You called ShutdownGoogleLogging() without calling InitGoogleLogging() first!";
  g_program_invocation_short_name = NULL;
#ifdef HAVE_SYSLOG_H
  closelog();
#endif
}